

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testIsEmpty<Imath_2_5::Vec2<double>>(char *type)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  double *pdVar6;
  char *in_RDI;
  Box<Imath_2_5::Vec2<double>_> b_1;
  Vec2<double> max;
  Vec2<double> min;
  Box<Imath_2_5::Vec2<double>_> b1;
  uint i;
  Vec2<double> p1;
  Vec2<double> p0;
  Box<Imath_2_5::Vec2<double>_> b0;
  Box<Imath_2_5::Vec2<double>_> b;
  Box<Imath_2_5::Vec2<double>_> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  Box<Imath_2_5::Vec2<double>_> *in_stack_ffffffffffffff10;
  Vec2<double> local_d0;
  Vec2<double> local_c0 [3];
  uint local_8c;
  Vec2<double> local_88;
  Vec2<double> local_78;
  Vec2<double> local_68;
  Vec2<double> local_58 [5];
  char *local_8;
  
  local_8 = in_RDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"    isEmpty() for type ");
  poVar5 = std::operator<<(poVar5,local_8);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec2<double>_>::Box(in_stack_ffffffffffffff00);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec2<double>_>::isEmpty
                    ((Box<Imath_2_5::Vec2<double>_> *)
                     CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  if (!bVar2) {
    __assert_fail("b.isEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2e8,
                  "void (anonymous namespace)::testIsEmpty(const char *) [T = Imath_2_5::Vec2<double>]"
                 );
  }
  Imath_2_5::Vec2<double>::Vec2(local_58,-1.0);
  Imath_2_5::Vec2<double>::Vec2(&local_68,1.0);
  Imath_2_5::Box<Imath_2_5::Vec2<double>_>::Box
            (in_stack_ffffffffffffff10,
             (Vec2<double> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             &in_stack_ffffffffffffff00->min);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec2<double>_>::isEmpty
                    ((Box<Imath_2_5::Vec2<double>_> *)
                     CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b0.isEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2f3,
                  "void (anonymous namespace)::testIsEmpty(const char *) [T = Imath_2_5::Vec2<double>]"
                 );
  }
  Imath_2_5::Vec2<double>::Vec2(&local_78);
  Imath_2_5::Vec2<double>::Vec2(&local_88);
  local_8c = 0;
  while( true ) {
    uVar4 = local_8c;
    uVar3 = Imath_2_5::Vec2<double>::dimensions();
    if (uVar3 <= uVar4) break;
    cVar1 = (char)local_8c;
    pdVar6 = Imath_2_5::Vec2<double>::operator[](&local_78,local_8c);
    *pdVar6 = -(double)(1 << (cVar1 + 1U & 0x1f));
    uVar4 = Imath_2_5::Vec2<double>::dimensions();
    in_stack_ffffffffffffff00 =
         (Box<Imath_2_5::Vec2<double>_> *)(double)(1 << ((char)uVar4 - (char)local_8c & 0x1fU));
    pdVar6 = Imath_2_5::Vec2<double>::operator[](&local_88,local_8c);
    *pdVar6 = (double)in_stack_ffffffffffffff00;
    local_8c = local_8c + 1;
  }
  Imath_2_5::Box<Imath_2_5::Vec2<double>_>::Box
            (in_stack_ffffffffffffff10,(Vec2<double> *)CONCAT44(uVar4,in_stack_ffffffffffffff08),
             &in_stack_ffffffffffffff00->min);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec2<double>_>::isEmpty
                    ((Box<Imath_2_5::Vec2<double>_> *)CONCAT44(uVar4,in_stack_ffffffffffffff08));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b1.isEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2fd,
                  "void (anonymous namespace)::testIsEmpty(const char *) [T = Imath_2_5::Vec2<double>]"
                 );
  }
  Imath_2_5::Vec2<double>::Vec2(local_c0,0.0);
  Imath_2_5::Vec2<double>::Vec2(&local_d0,local_c0);
  uVar3 = Imath_2_5::Vec2<double>::dimensions();
  pdVar6 = Imath_2_5::Vec2<double>::operator[](&local_d0,uVar3 - 1);
  *pdVar6 = 2.0;
  Imath_2_5::Box<Imath_2_5::Vec2<double>_>::Box
            (in_stack_ffffffffffffff10,(Vec2<double> *)CONCAT44(uVar4,in_stack_ffffffffffffff08),
             &in_stack_ffffffffffffff00->min);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec2<double>_>::isEmpty
                    ((Box<Imath_2_5::Vec2<double>_> *)CONCAT44(uVar4,in_stack_ffffffffffffff08));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.isEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x30e,
                  "void (anonymous namespace)::testIsEmpty(const char *) [T = Imath_2_5::Vec2<double>]"
                 );
  }
  return;
}

Assistant:

void
testIsEmpty(const char *type)
{
    cout << "    isEmpty() for type " << type << endl;

    //
    // Empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert(b.isEmpty());
    }

    //
    // Non-empty, has-volume box.
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0(T(-1), T(1));
        assert(!b0.isEmpty());

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions(); i++)
        {
           p0[i] = -typename T::BaseType(1 << (i + 1));
           p1[i] =  typename T::BaseType(1 << (T::dimensions() - i));
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1(p0, p1);
        assert(!b1.isEmpty());
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min(0);
        T max = min;
        max[T::dimensions() - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b(min, max);

        assert(!b.isEmpty());
    }
}